

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O2

int * Dsc_ComputeMatches(char *p)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  int pNested [16];
  int aiStack_48 [16];
  
  lVar2 = 0;
  piVar4 = Dsc_ComputeMatches::pMatches;
  iVar5 = 0;
  do {
    if (p[lVar2] == '\0') {
      if (iVar5 == 0) {
        return Dsc_ComputeMatches::pMatches;
      }
      __assert_fail("nNested == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dsc/dsc.c"
                    ,0x1d0,"int *Dsc_ComputeMatches(char *)");
    }
    *piVar4 = 0;
    bVar1 = p[lVar2];
    uVar3 = bVar1 - 0x28;
    if (uVar3 < 0x36) {
      if ((0x8000000100001U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_004405c8;
      if ((0x20000000400002U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_004405ad;
LAB_004405b9:
      Dsc_ComputeMatches::pMatches[aiStack_48[(long)iVar5 + -1]] = (int)lVar2;
      iVar5 = iVar5 + -1;
    }
    else {
LAB_004405ad:
      if (bVar1 == 0x7b) {
LAB_004405c8:
        aiStack_48[iVar5] = (int)lVar2;
        if (0xe < iVar5) {
          __assert_fail("nNested < DSC_MAX_VAR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dsc/dsc.c"
                        ,0x1ce,"int *Dsc_ComputeMatches(char *)");
        }
        iVar5 = iVar5 + 1;
      }
      else if (bVar1 == 0x7d) goto LAB_004405b9;
    }
    lVar2 = lVar2 + 1;
    piVar4 = piVar4 + 1;
  } while( true );
}

Assistant:

int * Dsc_ComputeMatches( char * p )
{
    static int pMatches[DSC_MAX_VAR];
    int pNested[DSC_MAX_VAR];
    int v, nNested = 0;
    for ( v = 0; p[v]; v++ )
    {
        pMatches[v] = 0;
        if ( p[v] == '(' || p[v] == '[' || p[v] == '<' || p[v] == '{' )
            pNested[nNested++] = v;
        else if ( p[v] == ')' || p[v] == ']' || p[v] == '>' || p[v] == '}' )
            pMatches[pNested[--nNested]] = v;
        assert( nNested < DSC_MAX_VAR );
    }
    assert( nNested == 0 );
    return pMatches;
}